

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUHal.cpp
# Opt level: O0

bool __thiscall
RTIMUHal::HALWrite(RTIMUHal *this,uchar slaveAddr,uchar regAddr,uchar length,uchar *data,
                  char *errorMsg)

{
  bool bVar1;
  size_t sVar2;
  char *local_140;
  char *ifType;
  uchar txBuff [256];
  int result;
  char *errorMsg_local;
  uchar *data_local;
  uchar length_local;
  uchar regAddr_local;
  RTIMUHal *pRStack_18;
  uchar slaveAddr_local;
  RTIMUHal *this_local;
  
  data_local._5_1_ = length;
  data_local._6_1_ = regAddr;
  data_local._7_1_ = slaveAddr;
  pRStack_18 = this;
  if ((this->m_busIsI2C & 1U) == 0) {
    local_140 = "SPI";
  }
  else {
    bVar1 = I2CSelectSlave(this,slaveAddr,errorMsg);
    if (!bVar1) {
      return false;
    }
    local_140 = "I2C";
  }
  if (data_local._5_1_ == 0) {
    bVar1 = ifWrite(this,(uchar *)((long)&data_local + 6),'\x01');
    txBuff._252_4_ = ZEXT14(bVar1);
    if (txBuff._252_4_ != 1) {
      sVar2 = strlen(errorMsg);
      if (sVar2 != 0) {
        fprintf(_stderr,"%s write of regAddr failed (nothing written) - %s\n",local_140,errorMsg);
      }
      return false;
    }
  }
  else {
    ifType._0_1_ = data_local._6_1_;
    memcpy((void *)((long)&ifType + 1),data,(ulong)data_local._5_1_);
    bVar1 = ifWrite(this,(uchar *)&ifType,data_local._5_1_ + 1);
    txBuff._252_4_ = ZEXT14(bVar1);
    if ((uint)txBuff._252_4_ < (uint)data_local._5_1_) {
      sVar2 = strlen(errorMsg);
      if (sVar2 != 0) {
        fprintf(_stderr,"%s data write of %d bytes failed, only %d written - %s\n",local_140,
                (ulong)data_local._5_1_,(ulong)(uint)txBuff._252_4_,errorMsg);
      }
      return false;
    }
  }
  return true;
}

Assistant:

bool RTIMUHal::HALWrite(unsigned char slaveAddr, unsigned char regAddr,
                   unsigned char length, unsigned char const *data, const char *errorMsg)
{
    int result;
    unsigned char txBuff[MAX_WRITE_LEN + 1];
    char *ifType;

    if (m_busIsI2C) {
        if (!I2CSelectSlave(slaveAddr, errorMsg))
            return false;
        ifType = (char *)"I2C";
    } else {
        ifType = (char *)"SPI";
    }

    if (length == 0) {
        result = ifWrite(&regAddr, 1);

        if (result < 0) {
            if (strlen(errorMsg) > 0)
                HAL_ERROR2("%s write of regAddr failed - %s\n", ifType, errorMsg);
            return false;
        } else if (result != 1) {
            if (strlen(errorMsg) > 0)
                HAL_ERROR2("%s write of regAddr failed (nothing written) - %s\n", ifType, errorMsg);
            return false;
        }
    } else {
        txBuff[0] = regAddr;
        memcpy(txBuff + 1, data, length);

        result = ifWrite(txBuff, length + 1);

        if (result < 0) {
            if (strlen(errorMsg) > 0)
                HAL_ERROR3("%s data write of %d bytes failed - %s\n", ifType, length, errorMsg);
            return false;
        } else if (result < (int)length) {
            if (strlen(errorMsg) > 0)
                HAL_ERROR4("%s data write of %d bytes failed, only %d written - %s\n", ifType, length, result, errorMsg);
            return false;
        }
    }
    return true;
}